

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O1

void __thiscall
SkeletalMesh::Scene::recursivelyGetTransf
          (Scene *this,SkeletonTransf *skTransf,SkeletonModifier *modifier,aiNode *node,
          aiMatrix4x4 parentTransf,aiMatrix4x4 *invTransf)

{
  char *__s;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  _Rb_tree_color _Var6;
  pointer pBVar7;
  pointer pmVar8;
  aiMatrix4x4 parentTransf_00;
  size_t sVar9;
  const_iterator cVar10;
  iterator iVar11;
  ulong uVar12;
  SkeletonTransf *skTransf_00;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float local_164;
  float local_160;
  float local_15c;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  float local_140;
  float local_13c;
  float local_12c;
  float local_128;
  float local_124;
  float local_11c;
  float local_118;
  float local_114;
  key_type local_c8;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  SkeletonTransf *local_78;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float local_40;
  float fStack_3c;
  float fStack_38;
  float fStack_34;
  
  fVar1 = (node->mTransformation).b1;
  fVar2 = (node->mTransformation).a1;
  fVar3 = (node->mTransformation).a2;
  fVar22 = (node->mTransformation).c1;
  fVar29 = (node->mTransformation).d1;
  fVar20 = (node->mTransformation).b2;
  fVar4 = (node->mTransformation).c2;
  fVar5 = (node->mTransformation).d2;
  fVar25 = (node->mTransformation).a3;
  fVar21 = (node->mTransformation).b3;
  fVar16 = (node->mTransformation).c3;
  fVar17 = (node->mTransformation).d3;
  fVar37 = (node->mTransformation).a4;
  fVar23 = (node->mTransformation).b4;
  fVar27 = (node->mTransformation).c4;
  fVar26 = (node->mTransformation).d4;
  __s = (node->mName).data;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_78 = skTransf;
  sVar9 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,__s,(node->mName).data + sVar9);
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::find(&(this->nameBoneMap)._M_t,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_144 = fVar29 * parentTransf.a4 +
              fVar22 * parentTransf.a3 + fVar2 * parentTransf.a1 + parentTransf.a2 * fVar1;
  local_148 = fVar5 * parentTransf.a4 +
              fVar4 * parentTransf.a3 + fVar3 * parentTransf.a1 + parentTransf.a2 * fVar20;
  local_154 = fVar17 * parentTransf.a4 +
              fVar16 * parentTransf.a3 + fVar25 * parentTransf.a1 + parentTransf.a2 * fVar21;
  local_114 = parentTransf.a4 * fVar26 +
              parentTransf.a3 * fVar27 + parentTransf.a1 * fVar37 + parentTransf.a2 * fVar23;
  local_140 = fVar29 * parentTransf.b4 +
              fVar22 * parentTransf.b3 + fVar2 * parentTransf.b1 + parentTransf.b2 * fVar1;
  local_12c = fVar5 * parentTransf.b4 +
              fVar4 * parentTransf.b3 + fVar3 * parentTransf.b1 + parentTransf.b2 * fVar20;
  local_150 = fVar17 * parentTransf.b4 +
              fVar16 * parentTransf.b3 + fVar25 * parentTransf.b1 + parentTransf.b2 * fVar21;
  local_124 = parentTransf.b4 * fVar26 +
              parentTransf.b3 * fVar27 + parentTransf.b1 * fVar37 + parentTransf.b2 * fVar23;
  local_14c = fVar29 * parentTransf.c4 +
              fVar22 * parentTransf.c3 + fVar2 * parentTransf.c1 + parentTransf.c2 * fVar1;
  local_11c = fVar5 * parentTransf.c4 +
              fVar4 * parentTransf.c3 + fVar3 * parentTransf.c1 + parentTransf.c2 * fVar20;
  local_160 = fVar17 * parentTransf.c4 +
              fVar16 * parentTransf.c3 + fVar25 * parentTransf.c1 + parentTransf.c2 * fVar21;
  local_118 = parentTransf.c4 * fVar26 +
              parentTransf.c3 * fVar27 + parentTransf.c1 * fVar37 + parentTransf.c2 * fVar23;
  local_164 = fVar29 * parentTransf.d4 +
              fVar22 * parentTransf.d3 + fVar2 * parentTransf.d1 + fVar1 * parentTransf.d2;
  local_13c = fVar5 * parentTransf.d4 +
              fVar4 * parentTransf.d3 + fVar3 * parentTransf.d1 + fVar20 * parentTransf.d2;
  local_15c = fVar17 * parentTransf.d4 +
              fVar16 * parentTransf.d3 + fVar25 * parentTransf.d1 + fVar21 * parentTransf.d2;
  local_128 = fVar26 * parentTransf.d4 +
              fVar27 * parentTransf.d3 + fVar37 * parentTransf.d1 + parentTransf.d2 * fVar23;
  skTransf_00 = local_78;
  if ((_Rb_tree_header *)cVar10._M_node != &(this->nameBoneMap)._M_t._M_impl.super__Rb_tree_header)
  {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    sVar9 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,__s,__s + sVar9);
    iVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>_>
             ::find(&modifier->_M_t,&local_c8);
    skTransf_00 = local_78;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar11._M_node != &(modifier->_M_t)._M_impl.super__Rb_tree_header) {
      fVar1 = (float)iVar11._M_node[2]._M_color;
      fVar2 = *(float *)&iVar11._M_node[2].field_0x4;
      fVar3 = *(float *)&iVar11._M_node[2]._M_parent;
      fVar22 = *(float *)&iVar11._M_node[2]._M_left;
      fVar13 = fVar22 * local_144;
      fVar29 = (float)iVar11._M_node[3]._M_color;
      fVar27 = fVar29 * local_144;
      fVar20 = *(float *)&iVar11._M_node[3]._M_left;
      fVar30 = local_144 * fVar20;
      fVar33 = fVar22 * local_140;
      fVar34 = fVar29 * local_140;
      fVar31 = local_140 * fVar20;
      fVar18 = fVar22 * local_14c;
      fVar19 = fVar29 * local_14c;
      fVar35 = local_14c * fVar20;
      fVar22 = fVar22 * local_164;
      fVar29 = fVar29 * local_164;
      fVar20 = fVar20 * local_164;
      fVar4 = *(float *)((long)&iVar11._M_node[2]._M_parent + 4);
      local_144 = fVar4 * local_114 + fVar3 * local_154 + fVar1 * local_144 + local_148 * fVar2;
      fVar5 = *(float *)((long)&iVar11._M_node[2]._M_left + 4);
      fVar25 = *(float *)&iVar11._M_node[2]._M_right;
      fVar15 = fVar25 * local_154;
      fVar21 = *(float *)((long)&iVar11._M_node[2]._M_right + 4);
      fVar14 = fVar21 * local_114;
      fVar16 = *(float *)&iVar11._M_node[3].field_0x4;
      fVar17 = *(float *)&iVar11._M_node[3]._M_parent;
      fVar37 = *(float *)&iVar11._M_node[3]._M_right;
      fVar38 = local_154 * fVar37;
      fVar36 = fVar25 * local_150;
      fVar24 = local_150 * fVar37;
      fVar28 = local_160 * fVar37;
      fVar32 = fVar25 * local_15c;
      fVar37 = fVar37 * local_15c;
      fVar23 = *(float *)((long)&iVar11._M_node[3]._M_parent + 4);
      local_154 = fVar23 * local_114 + fVar17 * local_154 + fVar27 + local_148 * fVar16;
      fVar27 = *(float *)((long)&iVar11._M_node[3]._M_left + 4);
      fVar26 = *(float *)((long)&iVar11._M_node[3]._M_right + 4);
      local_114 = local_114 * fVar26 + fVar38 + fVar30 + local_148 * fVar27;
      local_140 = fVar4 * local_124 + fVar3 * local_150 + fVar1 * local_140 + local_12c * fVar2;
      fVar30 = fVar21 * local_124;
      local_150 = fVar23 * local_124 + fVar17 * local_150 + fVar34 + local_12c * fVar16;
      local_124 = local_124 * fVar26 + fVar24 + fVar31 + local_12c * fVar27;
      local_14c = fVar4 * local_118 + fVar3 * local_160 + fVar1 * local_14c + local_11c * fVar2;
      local_11c = fVar21 * local_118 + fVar25 * local_160 + fVar18 + local_11c * fVar5;
      fVar25 = local_11c * fVar16;
      local_160 = fVar23 * local_118 + fVar17 * local_160 + fVar19 + fVar25;
      fVar25 = local_11c * fVar27;
      local_118 = local_118 * fVar26 + fVar28 + fVar35 + fVar25;
      local_164 = fVar4 * local_128 + fVar3 * local_15c + fVar1 * local_164 + fVar2 * local_13c;
      fVar21 = fVar21 * local_128;
      local_15c = fVar23 * local_128 + fVar17 * local_15c + fVar29 + fVar16 * local_13c;
      local_128 = fVar26 * local_128 + fVar37 + fVar20 + local_13c * fVar27;
      local_148 = fVar14 + fVar15 + fVar13 + local_148 * fVar5;
      local_13c = fVar21 + fVar32 + fVar22 + fVar5 * local_13c;
      local_12c = fVar30 + fVar36 + fVar33 + local_12c * fVar5;
    }
    fVar1 = invTransf->a1;
    fVar2 = invTransf->a2;
    fVar3 = invTransf->a3;
    fVar22 = invTransf->a4;
    fVar29 = invTransf->b1;
    fVar20 = invTransf->b2;
    fVar4 = invTransf->b3;
    fVar5 = invTransf->b4;
    fVar25 = invTransf->c1;
    fVar21 = invTransf->c2;
    fVar16 = invTransf->c3;
    fVar17 = invTransf->c4;
    fVar18 = local_164 * fVar22 + local_14c * fVar3 + local_144 * fVar1 + local_140 * fVar2;
    fVar14 = local_13c * fVar22 + local_11c * fVar3 + local_148 * fVar1 + local_12c * fVar2;
    fVar37 = local_15c * fVar22 + local_160 * fVar3 + local_154 * fVar1 + local_150 * fVar2;
    fVar19 = fVar22 * local_128 + fVar3 * local_118 + fVar1 * local_114 + fVar2 * local_124;
    local_80 = local_164 * fVar5 + local_14c * fVar4 + local_144 * fVar29 + local_140 * fVar20;
    fVar13 = local_13c * fVar5 + local_11c * fVar4 + local_148 * fVar29 + local_12c * fVar20;
    local_88 = local_15c * fVar5 + local_160 * fVar4 + local_154 * fVar29 + local_150 * fVar20;
    fVar27 = fVar5 * local_128 + fVar4 * local_118 + fVar29 * local_114 + fVar20 * local_124;
    fVar15 = local_164 * fVar17 + local_14c * fVar16 + local_144 * fVar25 + local_140 * fVar21;
    fVar26 = local_13c * fVar17 + local_11c * fVar16 + local_148 * fVar25 + local_12c * fVar21;
    local_7c = local_15c * fVar17 + local_160 * fVar16 + local_154 * fVar25 + local_150 * fVar21;
    fVar1 = invTransf->d1;
    fVar2 = invTransf->d2;
    fVar16 = fVar17 * local_128 + fVar16 * local_118 + fVar25 * local_114 + fVar21 * local_124;
    fVar3 = invTransf->d3;
    fVar22 = invTransf->d4;
    fVar17 = local_164 * fVar22 + local_14c * fVar3 + local_144 * fVar1 + local_140 * fVar2;
    fVar23 = local_13c * fVar22 + local_11c * fVar3 + local_148 * fVar1 + local_12c * fVar2;
    local_84 = local_15c * fVar22 + local_160 * fVar3 + local_154 * fVar1 + local_150 * fVar2;
    fVar30 = fVar22 * local_128 + fVar3 * local_118 + fVar1 * local_114 + fVar2 * local_124;
    _Var6 = cVar10._M_node[2]._M_color;
    pBVar7 = (this->skeleton).
             super__Vector_base<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_9c = pBVar7[_Var6].localTransf.b1;
    local_94 = pBVar7[_Var6].localTransf.a1;
    fVar1 = pBVar7[_Var6].localTransf.c1;
    fVar2 = pBVar7[_Var6].localTransf.d1;
    local_98 = pBVar7[_Var6].localTransf.b2;
    fVar3 = pBVar7[_Var6].localTransf.a2;
    fVar22 = pBVar7[_Var6].localTransf.c2;
    fVar29 = pBVar7[_Var6].localTransf.d2;
    local_a0 = pBVar7[_Var6].localTransf.b3;
    fVar20 = pBVar7[_Var6].localTransf.a3;
    local_a4 = pBVar7[_Var6].localTransf.c3;
    fVar4 = pBVar7[_Var6].localTransf.d3;
    local_a8 = pBVar7[_Var6].localTransf.b4;
    fVar5 = pBVar7[_Var6].localTransf.a4;
    fVar25 = pBVar7[_Var6].localTransf.c4;
    fVar21 = pBVar7[_Var6].localTransf.d4;
    local_8c = fVar29 * fVar27 + fVar22 * local_88 + fVar3 * local_80 + fVar13 * local_98;
    local_90 = fVar4 * fVar27 + local_a4 * local_88 + fVar20 * local_80 + fVar13 * local_a0;
    pmVar8 = (skTransf_00->
             super__Vector_base<glm::mat<4,_4,_float,_(glm::qualifier)0>,_std::allocator<glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pmVar8[_Var6].value[0].field_0.x =
         fVar2 * fVar19 + fVar1 * fVar37 + local_94 * fVar18 + fVar14 * local_9c;
    pmVar8[_Var6].value[0].field_1.y =
         fVar2 * fVar27 + fVar1 * local_88 + local_94 * local_80 + fVar13 * local_9c;
    pmVar8[_Var6].value[0].field_2.z =
         fVar2 * fVar16 + fVar1 * local_7c + local_94 * fVar15 + fVar26 * local_9c;
    pmVar8[_Var6].value[0].field_3.w =
         fVar2 * fVar30 + fVar1 * local_84 + local_94 * fVar17 + local_9c * fVar23;
    pmVar8[_Var6].value[1].field_0.x =
         fVar29 * fVar19 + fVar22 * fVar37 + fVar3 * fVar18 + fVar14 * local_98;
    pmVar8[_Var6].value[1].field_1.y = local_8c;
    pmVar8[_Var6].value[1].field_2.z =
         fVar29 * fVar16 + fVar22 * local_7c + fVar3 * fVar15 + fVar26 * local_98;
    pmVar8[_Var6].value[1].field_3.w =
         fVar29 * fVar30 + fVar22 * local_84 + fVar3 * fVar17 + local_98 * fVar23;
    pmVar8[_Var6].value[2].field_0.x =
         fVar4 * fVar19 + local_a4 * fVar37 + fVar20 * fVar18 + fVar14 * local_a0;
    pmVar8[_Var6].value[2].field_1.y = local_90;
    pmVar8[_Var6].value[2].field_2.z =
         fVar4 * fVar16 + local_a4 * local_7c + fVar20 * fVar15 + fVar26 * local_a0;
    pmVar8[_Var6].value[2].field_3.w =
         fVar4 * fVar30 + local_a4 * local_84 + fVar20 * fVar17 + local_a0 * fVar23;
    pmVar8[_Var6].value[3].field_0.x =
         fVar19 * fVar21 + fVar37 * fVar25 + fVar18 * fVar5 + fVar14 * local_a8;
    pmVar8[_Var6].value[3].field_1.y =
         fVar27 * fVar21 + local_88 * fVar25 + local_80 * fVar5 + fVar13 * local_a8;
    pmVar8[_Var6].value[3].field_2.z =
         fVar16 * fVar21 + local_7c * fVar25 + fVar15 * fVar5 + fVar26 * local_a8;
    pmVar8[_Var6].value[3].field_3.w =
         fVar30 * fVar21 + local_84 * fVar25 + fVar17 * fVar5 + fVar23 * local_a8;
  }
  if (node->mNumChildren != 0) {
    uVar12 = 0;
    do {
      parentTransf_00.a2 = local_148;
      parentTransf_00.a1 = local_144;
      parentTransf_00.a4 = local_114;
      parentTransf_00.a3 = local_154;
      parentTransf_00.b2 = local_12c;
      parentTransf_00.b1 = local_140;
      parentTransf_00.b4 = local_124;
      parentTransf_00.b3 = local_150;
      parentTransf_00.c2 = local_11c;
      parentTransf_00.c1 = local_14c;
      parentTransf_00.c4 = local_118;
      parentTransf_00.c3 = local_160;
      parentTransf_00.d2 = local_13c;
      parentTransf_00.d1 = local_164;
      parentTransf_00.d4 = local_128;
      parentTransf_00.d3 = local_15c;
      local_70 = local_144;
      fStack_6c = local_148;
      fStack_68 = local_154;
      fStack_64 = local_114;
      local_60 = local_140;
      fStack_5c = local_12c;
      fStack_58 = local_150;
      fStack_54 = local_124;
      local_50 = local_14c;
      fStack_4c = local_11c;
      fStack_48 = local_160;
      fStack_44 = local_118;
      local_40 = local_164;
      fStack_3c = local_13c;
      fStack_38 = local_15c;
      fStack_34 = local_128;
      recursivelyGetTransf
                (this,skTransf_00,modifier,node->mChildren[uVar12],parentTransf_00,invTransf);
      uVar12 = uVar12 + 1;
    } while (uVar12 < node->mNumChildren);
  }
  return;
}

Assistant:

void recursivelyGetTransf(SkeletonTransf &skTransf, SkeletonModifier &modifier, aiNode *node,
                                  aiMatrix4x4 parentTransf, const aiMatrix4x4 &invTransf) const {
            aiMatrix4x4 globalTransf = parentTransf * node->mTransformation;
            Name2Bone::const_iterator boneFound = nameBoneMap.find(std::string(node->mName.data));
            if (boneFound != nameBoneMap.end()) {
                SkeletonModifier::const_iterator boneModFound = modifier.find(std::string(node->mName.data));
                aiMatrix4x4 boneMod;
                if (boneModFound != modifier.end()) {
                    auto trans = glm::transpose(boneModFound->second);
                    memcpy(&boneMod, &trans, 16 * sizeof(float));
                    globalTransf *= boneMod;
                }
                aiMatrix4x4 finalMtrx = invTransf * globalTransf * skeleton[boneFound->second].localTransf;
                memcpy(&skTransf[boneFound->second], &finalMtrx.Transpose(), sizeof(skTransf[boneFound->second]));
            }
            for (int i = 0; i < node->mNumChildren; i++) {
                recursivelyGetTransf(skTransf, modifier, node->mChildren[i], globalTransf, invTransf);
            }
        }